

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconvert_linux.c
# Opt level: O2

void CharConvSU(charconv *CC,char *Out,size_t OutLen,utf16_t *In)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  ushort uVar4;
  char *_Out;
  size_t _OutLen;
  size_t _InLen;
  char *_In;
  
  if (OutLen != 0) {
    _In = (char *)In;
    sVar1 = utf16len(In);
    _InLen = sVar1 + 1;
    _Out = Out;
    _OutLen = OutLen;
    if (((_InLen == 0 || CC == (charconv *)0x0) ||
        (sVar2 = iconv(CC,&_In,&_InLen,&_Out,&_OutLen), sVar2 == 0xffffffffffffffff)) ||
       (sVar2 = iconv(CC,(char **)0x0,(size_t *)0x0,&_Out,&_OutLen), sVar2 == 0xffffffffffffffff)) {
      for (lVar3 = 0; (1 < OutLen && (uVar4 = In[lVar3], uVar4 != 0)); lVar3 = lVar3 + 1) {
        if (0xff < uVar4) {
          uVar4 = 0x2a;
        }
        Out[lVar3] = (char)uVar4;
        OutLen = OutLen - 1;
      }
      Out[lVar3] = '\0';
      if ((CC != (charconv *)0x0) && (_InLen != 0)) {
        iconv(CC,(char **)0x0,(size_t *)0x0,(char **)0x0,(size_t *)0x0);
      }
    }
    else {
      *_Out = '\0';
    }
  }
  return;
}

Assistant:

void CharConvSU(charconv* CC, char* Out, size_t OutLen, const utf16_t* In)
{
    if (OutLen>0)
    {
        ICONV_CONST char* _In = (ICONV_CONST char*)In;
        size_t _InLen = utf16len(In)+1;
        char* _Out = Out;
        size_t _OutLen = OutLen;

        if (!CC || !_InLen || iconv((iconv_t)CC, &_In, &_InLen, &_Out, &_OutLen) == (size_t)-1 ||
                    iconv((iconv_t)CC, NULL, NULL, &_Out, &_OutLen) == (size_t)-1)
        {
            for (;OutLen>1 && *In;++In,--OutLen,++Out)
                *Out = (char)(*In>255?'*':*In);
            *Out = 0;
            if (CC && _InLen) iconv((iconv_t)CC, NULL, NULL, NULL, NULL); // reset state
        }
        else
            *_Out=0;
    }
}